

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ustar_filename_encoding.c
# Opt level: O0

void test_ustar_filename_encoding_ru_RU_CP1251(void)

{
  int iVar1;
  char *pcVar2;
  archive_conflict *a_00;
  size_t local_1020;
  size_t used;
  char buff [4096];
  archive_entry *entry;
  archive *a;
  
  pcVar2 = setlocale(6,"ru_RU.CP1251");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                   ,L'Í');
    test_skipping("KOI8-R locale not available on this system.");
  }
  else {
    a_00 = (archive_conflict *)archive_write_new();
    iVar1 = archive_write_set_format_ustar((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Ö',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                        (void *)0x0);
    iVar1 = archive_write_open_memory((archive *)a_00,&used,0x1000,&local_1020);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'Ø',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
    buff._4088_8_ = archive_entry_new2(a_00);
    archive_entry_set_pathname((archive_entry *)buff._4088_8_,anon_var_dwarf_1737c);
    archive_entry_set_filetype((archive_entry *)buff._4088_8_,0x8000);
    archive_entry_set_size((archive_entry *)buff._4088_8_,0);
    iVar1 = archive_write_header((archive *)a_00,(archive_entry *)buff._4088_8_);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'ß',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free((archive_entry *)buff._4088_8_);
    iVar1 = archive_write_free((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'á',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filename_encoding.c"
                        ,L'å',&used,"buff",anon_var_dwarf_1737c,"\"\\xEF\\xF0\\xE8\"",3,"3",
                        (void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_ustar_filename_encoding_ru_RU_CP1251)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "ru_RU.CP1251")) {
		skipping("KOI8-R locale not available on this system.");
		return;
	}

	/*
	 * Verify that CP1251 filenames are not translated into any
	 * other character-set, in particular, CP866.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a KOI8-R filename. */
	archive_entry_set_pathname(entry, "\xEF\xF0\xE8");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Above three characters in CP1251 should not translate to
	 * any other character-set. */
	assertEqualMem(buff, "\xEF\xF0\xE8", 3);
}